

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O3

char RDL_checkGraphConnected(RDL_graph *gra)

{
  uint uVar1;
  char *visited;
  ulong uVar2;
  char cVar3;
  ulong __size;
  
  uVar1 = gra->V;
  __size = (ulong)uVar1;
  visited = (char *)malloc(__size);
  *visited = '\x01';
  if (__size < 2) {
    RDL_DFSvisit(gra,0,visited);
    if (__size == 0) goto LAB_0010756f;
  }
  else {
    memset(visited + 1,0,(ulong)(uVar1 - 1));
    RDL_DFSvisit(gra,0,visited);
  }
  uVar2 = 0;
  do {
    if (visited[uVar2] == '\0') {
      cVar3 = '\0';
      goto LAB_00107576;
    }
    uVar2 = uVar2 + 1;
  } while (__size != uVar2);
LAB_0010756f:
  cVar3 = '\x01';
LAB_00107576:
  free(visited);
  return cVar3;
}

Assistant:

char RDL_checkGraphConnected(const RDL_graph *gra)
{
  unsigned i;
  char *visited;
  char result;
  result = 1;
  visited = malloc(gra->V * sizeof(*visited));
  visited[0] = 1; /*start vertex*/
  for(i=1; i<gra->V; ++i)
  {
    visited[i] = 0; /*unvisited*/
  }
  RDL_DFSvisit(gra, 0, visited);
  for(i=0; i<gra->V; ++i)
  {
    if(visited[i] == 0) /*one was unvisited*/
    {
      result = 0;
      break;
    }
  }

  free(visited);
  return result;
}